

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

string * __thiscall
kratos::get_trigger_attribute_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,shared_ptr<kratos::StmtBlock> *blk)

{
  size_type sVar1;
  _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  it;
  undefined8 *puVar2;
  stringstream local_260 [16];
  ostream local_250;
  undefined1 local_d8 [8];
  TriggerConditionVisitor visitor;
  allocator<char> local_31;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8 = (undefined1  [8])&PTR_visit_root_002b3ac0;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.values._M_h._M_rehash_policy._M_next_resize;
  visitor.values._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.values._M_h._M_bucket_count = 0;
  visitor.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.values._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.values._M_h._M_rehash_policy._4_4_ = 0;
  visitor.values._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root((IRVisitor *)local_d8,*(IRNode **)this);
  sVar1 = visitor.values._M_h._M_bucket_count;
  if (visitor.values._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_260);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&visitor.values._M_h._M_single_bucket," ",&local_31);
    std::__cxx11::stringstream::stringstream(local_260);
    for (puVar2 = (undefined8 *)sVar1; puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2)
    {
      if (puVar2 != (undefined8 *)sVar1) {
        std::operator<<(&local_250,(string *)&visitor.values._M_h._M_single_bucket);
      }
      std::operator<<(&local_250,(string *)(puVar2 + 1));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_260);
    std::__cxx11::string::~string((string *)&visitor.values._M_h._M_single_bucket);
  }
  TriggerConditionVisitor::~TriggerConditionVisitor((TriggerConditionVisitor *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string get_trigger_attribute(const std::shared_ptr<StmtBlock> &blk) {
    TriggerConditionVisitor visitor;
    visitor.visit_root(blk.get());
    auto const &values = visitor.values;
    if (values.empty()) return "";
    return string::join(values.begin(), values.end(), " ");
}